

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

int32_t internal_exr_compute_chunk_offset_size(_internal_exr_part *curpart)

{
  int *piVar1;
  uint *puVar2;
  undefined2 uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long in_RDI;
  uint64_t w;
  uint64_t unpackedsize;
  exr_attr_chlist_t *channels;
  exr_attr_box2i_t dw;
  int32_t retval;
  long local_b0;
  int local_94;
  ulong local_88;
  long local_80;
  uint64_t cunpsz_1;
  uint64_t ysamp_1;
  uint64_t xsamp_1;
  long lStack_58;
  int c_1;
  uint64_t h;
  uint64_t linePerChunk;
  uint64_t cunpsz;
  uint64_t ysamp;
  uint64_t xsamp;
  int c;
  int32_t ly;
  int32_t lx;
  int32_t l;
  int64_t tilecount;
  exr_attr_tiledesc_t *tiledesc;
  int hasLineSample;
  
  piVar1 = *(int **)(*(long *)(in_RDI + 0x20) + 0x18);
  ysamp = 0;
  uVar3 = 0;
  l = (int32_t)*(undefined8 *)(in_RDI + 0x98);
  ly = (int32_t)*(undefined8 *)(in_RDI + 0x90);
  if (*(long *)(in_RDI + 0x60) == 0) {
    switch(*(undefined4 *)(in_RDI + 0xb0)) {
    case 0:
    case 1:
    case 2:
      local_88 = 1;
      break;
    case 3:
    case 5:
      local_88 = 0x10;
      break;
    case 4:
    case 6:
    case 7:
    case 8:
      local_88 = 0x20;
      break;
    case 9:
      local_88 = 0x100;
      break;
    case 10:
    default:
      return -1;
    }
    for (local_94 = 0; local_94 < *piVar1; local_94 = local_94 + 1) {
      uVar5 = (ulong)*(int *)(*(long *)(piVar1 + 2) + (long)local_94 * 0x20 + 0x1c);
      if (*(int *)(*(long *)(piVar1 + 2) + (long)local_94 * 0x20 + 0x10) == 1) {
        local_b0 = 2;
      }
      else {
        local_b0 = 4;
      }
      local_b0 = local_88 *
                 ((((long)l - (long)ly) + 1U) /
                 (ulong)(long)*(int *)(*(long *)(piVar1 + 2) + (long)local_94 * 0x20 + 0x18)) *
                 local_b0;
      if ((1 < uVar5) && (uVar3 = 1, 1 < local_88)) {
        local_b0 = (local_88 / uVar5) * local_b0;
      }
      ysamp = local_b0 + ysamp;
    }
    *(uint64_t *)(in_RDI + 0xe8) = ysamp;
    *(short *)(in_RDI + 0xf0) = (short)local_88;
    *(undefined2 *)(in_RDI + 0xf2) = uVar3;
    tilecount._0_4_ = (int)((ulong)*(undefined8 *)(in_RDI + 0x98) >> 0x20);
    lx = (int32_t)((ulong)*(undefined8 *)(in_RDI + 0x90) >> 0x20);
    tilecount._4_4_ = (int32_t)((((long)(int)tilecount - (long)lx) + local_88) / local_88);
  }
  else {
    puVar2 = *(uint **)(*(long *)(in_RDI + 0x60) + 0x18);
    lStack_58 = 0;
    bVar4 = (byte)puVar2[2] & 0xf;
    if (bVar4 < 2) {
      for (xsamp_1._4_4_ = 0; xsamp_1._4_4_ < *(int *)(in_RDI + 0xc0);
          xsamp_1._4_4_ = xsamp_1._4_4_ + 1) {
        lStack_58 = (long)*(int *)(*(long *)(in_RDI + 200) + (long)xsamp_1._4_4_ * 4) *
                    (long)*(int *)(*(long *)(in_RDI + 0xd0) + (long)xsamp_1._4_4_ * 4) + lStack_58;
      }
      if (0x7fffffff < lStack_58) {
        return -1;
      }
      tilecount._4_4_ = (int32_t)lStack_58;
    }
    else {
      if (bVar4 != 2) {
        return -1;
      }
      for (xsamp_1._0_4_ = 0; (int)xsamp_1 < *(int *)(in_RDI + 0xc0);
          xsamp_1._0_4_ = (int)xsamp_1 + 1) {
        for (ysamp_1._4_4_ = 0; ysamp_1._4_4_ < *(int *)(in_RDI + 0xc4);
            ysamp_1._4_4_ = ysamp_1._4_4_ + 1) {
          lStack_58 = (long)*(int *)(*(long *)(in_RDI + 200) + (long)(int)xsamp_1 * 4) *
                      (long)*(int *)(*(long *)(in_RDI + 0xd0) + (long)ysamp_1._4_4_ * 4) + lStack_58
          ;
          if (0x7fffffff < lStack_58) {
            return -1;
          }
        }
      }
      tilecount._4_4_ = (int32_t)lStack_58;
    }
    for (ysamp_1._0_4_ = 0; (int)ysamp_1 < *piVar1; ysamp_1._0_4_ = (int)ysamp_1 + 1) {
      uVar5 = (ulong)*(int *)(*(long *)(piVar1 + 2) + (long)(int)ysamp_1 * 0x20 + 0x18);
      uVar6 = (ulong)*(int *)(*(long *)(piVar1 + 2) + (long)(int)ysamp_1 * 0x20 + 0x1c);
      if (*(int *)(*(long *)(piVar1 + 2) + (long)(int)ysamp_1 * 0x20 + 0x10) == 1) {
        local_80 = 2;
      }
      else {
        local_80 = 4;
      }
      if (uVar6 < 2) {
        uVar6 = (ulong)puVar2[1];
      }
      else {
        uVar3 = 1;
        uVar6 = ((puVar2[1] + uVar6) - 1) / uVar6;
      }
      local_80 = uVar6 * (((*puVar2 + uVar5) - 1) / uVar5) * local_80;
      ysamp = local_80 + ysamp;
    }
    *(uint64_t *)(in_RDI + 0xe8) = ysamp;
    *(undefined2 *)(in_RDI + 0xf2) = uVar3;
  }
  return tilecount._4_4_;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (struct _internal_exr_part* curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (((uint64_t) tiledesc->x_size + xsamp - 1) / xsamp);
            if (ysamp > 1)
            {
                hasLineSample = 1;
                cunpsz *= (((uint64_t) tiledesc->y_size + ysamp - 1) / ysamp);
            }
            else
                cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        uint64_t linePerChunk, h;
        switch (curpart->comp_type)
        {
            case EXR_COMPRESSION_NONE:
            case EXR_COMPRESSION_RLE:
            case EXR_COMPRESSION_ZIPS: linePerChunk = 1; break;
            case EXR_COMPRESSION_ZIP:
            case EXR_COMPRESSION_PXR24: linePerChunk = 16; break;
            case EXR_COMPRESSION_PIZ:
            case EXR_COMPRESSION_B44:
            case EXR_COMPRESSION_B44A:
            case EXR_COMPRESSION_DWAA: linePerChunk = 32; break;
            case EXR_COMPRESSION_DWAB: linePerChunk = 256; break;
            case EXR_COMPRESSION_LAST_TYPE:
            default:
                /* ERROR CONDITION */
                return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= w / xsamp;
            cunpsz *= linePerChunk;
            if (ysamp > 1)
            {
                hasLineSample = 1;
                if (linePerChunk > 1) cunpsz *= linePerChunk / ysamp;
            }
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->lines_per_chunk         = ((int16_t) linePerChunk);
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}